

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::Model::MergePartialFromCodedStream(Model *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  short extraout_AX;
  short extraout_AX_00;
  short sVar5;
  int iVar6;
  uint uVar7;
  uint32 uVar8;
  OneHotEncoder *this_00;
  ulong extraout_RAX;
  GLMRegressor *this_01;
  ulong extraout_RAX_00;
  GLMClassifier *this_02;
  ulong extraout_RAX_01;
  TextClassifier *this_03;
  ulong extraout_RAX_02;
  ModelDescription *this_04;
  ulong extraout_RAX_03;
  ItemSimilarityRecommender *this_05;
  ulong extraout_RAX_04;
  SerializedModel *this_06;
  ulong extraout_RAX_05;
  PipelineClassifier *this_07;
  ulong extraout_RAX_06;
  CustomModel *this_08;
  ulong extraout_RAX_07;
  Pipeline *this_09;
  ulong extraout_RAX_08;
  LinkedModel *this_10;
  ulong extraout_RAX_09;
  NonMaximumSuppression *this_11;
  ulong extraout_RAX_10;
  Normalizer *this_12;
  ulong extraout_RAX_11;
  DictVectorizer *this_13;
  ulong extraout_RAX_12;
  CategoricalMapping *this_14;
  ulong extraout_RAX_13;
  FeatureVectorizer *this_15;
  ulong extraout_RAX_14;
  ArrayFeatureExtractor *this_16;
  ulong extraout_RAX_15;
  Imputer *this_17;
  ulong extraout_RAX_16;
  Scaler *this_18;
  ulong extraout_RAX_17;
  Gazetteer *this_19;
  ulong extraout_RAX_18;
  KNearestNeighborsClassifier *this_20;
  ulong extraout_RAX_19;
  NeuralNetwork *this_21;
  ulong extraout_RAX_20;
  Program *this_22;
  ulong extraout_RAX_21;
  VisionFeaturePrint *this_23;
  ulong extraout_RAX_22;
  Identity *this_24;
  ulong extraout_RAX_23;
  TreeEnsembleClassifier *this_25;
  ulong extraout_RAX_24;
  SoundAnalysisPreprocessing *this_26;
  ulong extraout_RAX_25;
  WordTagger *this_27;
  ulong extraout_RAX_26;
  NeuralNetworkClassifier *this_28;
  ulong extraout_RAX_27;
  SupportVectorClassifier *this_29;
  ulong extraout_RAX_28;
  WordEmbedding *this_30;
  ulong extraout_RAX_29;
  AudioFeaturePrint *this_31;
  ulong extraout_RAX_30;
  BayesianProbitRegressor *this_32;
  ulong extraout_RAX_31;
  TreeEnsembleRegressor *this_33;
  ulong extraout_RAX_32;
  PipelineRegressor *this_34;
  ulong extraout_RAX_33;
  NeuralNetworkRegressor *this_35;
  ulong extraout_RAX_34;
  SupportVectorRegressor *this_36;
  ulong extraout_RAX_35;
  char cVar9;
  uint uVar10;
  ulong uVar11;
  int local_5c;
  
  do {
    pbVar3 = input->buffer_;
    uVar8 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      pbVar1 = pbVar3 + 1;
      uVar10 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar8 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) ||
           (uVar8 = (uint)bVar2, (~(uint)*pbVar1 & uVar10) < 0x80)) goto LAB_001fe625;
        uVar10 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = (ulong)uVar10 | 0x100000000;
    }
    else {
LAB_001fe625:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar11 = 0;
      if (uVar8 - 1 < 0x5dc2) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar8 | uVar11;
    }
    uVar10 = (uint)uVar11;
    if ((uVar11 & 0x100000000) == 0) goto switchD_001fd7f3_caseD_25d;
    uVar7 = (uint)(uVar11 >> 3) & 0x1fffffff;
    cVar9 = (char)uVar11;
    if (uVar7 < 0x22c) {
      if (399 < uVar7) {
        if (uVar7 < 500) {
          switch(uVar7) {
          case 400:
            if (cVar9 == -0x7e) {
              if (this->_oneof_case_[0] != 400) {
                clear_Type(this);
                this->_oneof_case_[0] = 400;
                this_02 = (GLMClassifier *)operator_new(0x58);
                GLMClassifier::GLMClassifier(this_02);
                (this->Type_).glmclassifier_ = this_02;
              }
              MergePartialFromCodedStream();
              uVar11 = extraout_RAX_01;
              goto LAB_001fe5b7;
            }
            break;
          case 0x191:
            if (cVar9 == -0x76) {
              if (this->_oneof_case_[0] != 0x191) {
                clear_Type(this);
                this->_oneof_case_[0] = 0x191;
                this_29 = (SupportVectorClassifier *)operator_new(0xb0);
                SupportVectorClassifier::SupportVectorClassifier(this_29);
                (this->Type_).supportvectorclassifier_ = this_29;
              }
              MergePartialFromCodedStream();
              uVar11 = extraout_RAX_28;
              goto LAB_001fe5b7;
            }
            break;
          case 0x192:
            if (cVar9 == -0x6e) {
              if (this->_oneof_case_[0] != 0x192) {
                clear_Type(this);
                this->_oneof_case_[0] = 0x192;
                this_25 = (TreeEnsembleClassifier *)operator_new(0x30);
                TreeEnsembleClassifier::TreeEnsembleClassifier(this_25);
                (this->Type_).treeensembleclassifier_ = this_25;
              }
              MergePartialFromCodedStream();
              uVar11 = extraout_RAX_24;
              goto LAB_001fe5b7;
            }
            break;
          case 0x193:
            if (cVar9 == -0x66) {
              if (this->_oneof_case_[0] != 0x193) {
                clear_Type(this);
                this->_oneof_case_[0] = 0x193;
                this_28 = (NeuralNetworkClassifier *)operator_new(0x68);
                NeuralNetworkClassifier::NeuralNetworkClassifier(this_28);
                (this->Type_).neuralnetworkclassifier_ = this_28;
              }
              MergePartialFromCodedStream();
              uVar11 = extraout_RAX_27;
              goto LAB_001fe5b7;
            }
            break;
          case 0x194:
            if (cVar9 == -0x5e) {
              if (this->_oneof_case_[0] != 0x194) {
                clear_Type(this);
                this->_oneof_case_[0] = 0x194;
                this_20 = (KNearestNeighborsClassifier *)operator_new(0x48);
                KNearestNeighborsClassifier::KNearestNeighborsClassifier(this_20);
                (this->Type_).knearestneighborsclassifier_ = this_20;
              }
              MergePartialFromCodedStream();
              uVar11 = extraout_RAX_19;
              goto LAB_001fe5b7;
            }
          }
          goto switchD_001fd7f3_caseD_25d;
        }
        if (uVar7 < 0x1f6) {
          if (uVar7 == 500) {
            if (cVar9 != -0x5e) goto switchD_001fd7f3_caseD_25d;
            if (this->_oneof_case_[0] != 500) {
              clear_Type(this);
              this->_oneof_case_[0] = 500;
              this_21 = (NeuralNetwork *)operator_new(0x58);
              NeuralNetwork::NeuralNetwork(this_21);
              (this->Type_).neuralnetwork_ = this_21;
            }
            MergePartialFromCodedStream();
            uVar11 = extraout_RAX_20;
          }
          else {
            if ((uVar7 != 0x1f5) || (cVar9 != -0x56)) goto switchD_001fd7f3_caseD_25d;
            if (this->_oneof_case_[0] != 0x1f5) {
              clear_Type(this);
              this->_oneof_case_[0] = 0x1f5;
              this_05 = (ItemSimilarityRecommender *)operator_new(0x70);
              ItemSimilarityRecommender::ItemSimilarityRecommender(this_05);
              (this->Type_).itemsimilarityrecommender_ = this_05;
            }
            MergePartialFromCodedStream();
            uVar11 = extraout_RAX_04;
          }
        }
        else if (uVar7 == 0x1f6) {
          if (cVar9 != -0x4e) goto switchD_001fd7f3_caseD_25d;
          if (this->_oneof_case_[0] != 0x1f6) {
            clear_Type(this);
            this->_oneof_case_[0] = 0x1f6;
            this_22 = (Program *)operator_new(0x68);
            MILSpec::Program::Program(this_22);
            (this->Type_).mlprogram_ = this_22;
          }
          MergePartialFromCodedStream();
          uVar11 = extraout_RAX_21;
        }
        else {
          if ((uVar7 != 0x22b) || (cVar9 != 'Z')) goto switchD_001fd7f3_caseD_25d;
          if (this->_oneof_case_[0] != 0x22b) {
            clear_Type(this);
            this->_oneof_case_[0] = 0x22b;
            this_08 = (CustomModel *)operator_new(0x48);
            CustomModel::CustomModel(this_08);
            (this->Type_).custommodel_ = this_08;
          }
          MergePartialFromCodedStream();
          uVar11 = extraout_RAX_07;
        }
        goto LAB_001fe5b7;
      }
      if (200 < uVar7) {
        switch(uVar7) {
        case 300:
          if (cVar9 != 'b') goto switchD_001fd7f3_caseD_25d;
          if (this->_oneof_case_[0] != 300) {
            clear_Type(this);
            this->_oneof_case_[0] = 300;
            this_01 = (GLMRegressor *)operator_new(0x48);
            GLMRegressor::GLMRegressor(this_01);
            (this->Type_).glmregressor_ = this_01;
          }
          MergePartialFromCodedStream();
          uVar11 = extraout_RAX_00;
          break;
        case 0x12d:
          if (cVar9 != 'j') goto switchD_001fd7f3_caseD_25d;
          if (this->_oneof_case_[0] != 0x12d) {
            clear_Type(this);
            this->_oneof_case_[0] = 0x12d;
            this_36 = (SupportVectorRegressor *)operator_new(0x38);
            SupportVectorRegressor::SupportVectorRegressor(this_36);
            (this->Type_).supportvectorregressor_ = this_36;
          }
          MergePartialFromCodedStream();
          uVar11 = extraout_RAX_35;
          break;
        case 0x12e:
          if (cVar9 != 'r') goto switchD_001fd7f3_caseD_25d;
          if (this->_oneof_case_[0] != 0x12e) {
            clear_Type(this);
            this->_oneof_case_[0] = 0x12e;
            this_33 = (TreeEnsembleRegressor *)operator_new(0x20);
            TreeEnsembleRegressor::TreeEnsembleRegressor(this_33);
            (this->Type_).treeensembleregressor_ = this_33;
          }
          MergePartialFromCodedStream();
          uVar11 = extraout_RAX_32;
          break;
        case 0x12f:
          if (cVar9 != 'z') goto switchD_001fd7f3_caseD_25d;
          if (this->_oneof_case_[0] != 0x12f) {
            clear_Type(this);
            this->_oneof_case_[0] = 0x12f;
            this_35 = (NeuralNetworkRegressor *)operator_new(0x58);
            NeuralNetworkRegressor::NeuralNetworkRegressor(this_35);
            (this->Type_).neuralnetworkregressor_ = this_35;
          }
          MergePartialFromCodedStream();
          uVar11 = extraout_RAX_34;
          break;
        case 0x130:
          if (cVar9 != -0x7e) goto switchD_001fd7f3_caseD_25d;
          if (this->_oneof_case_[0] != 0x130) {
            clear_Type(this);
            this->_oneof_case_[0] = 0x130;
            this_32 = (BayesianProbitRegressor *)operator_new(0x78);
            BayesianProbitRegressor::BayesianProbitRegressor(this_32);
            (this->Type_).bayesianprobitregressor_ = this_32;
          }
          MergePartialFromCodedStream();
          uVar11 = extraout_RAX_31;
          break;
        default:
          if (uVar7 == 0xc9) {
            if (cVar9 != 'J') goto switchD_001fd7f3_caseD_25d;
            if (this->_oneof_case_[0] != 0xc9) {
              clear_Type(this);
              this->_oneof_case_[0] = 0xc9;
              this_34 = (PipelineRegressor *)operator_new(0x20);
              PipelineRegressor::PipelineRegressor(this_34);
              (this->Type_).pipelineregressor_ = this_34;
            }
            MergePartialFromCodedStream();
            uVar11 = extraout_RAX_33;
          }
          else {
            if ((uVar7 != 0xca) || (cVar9 != 'R')) goto switchD_001fd7f3_caseD_25d;
            if (this->_oneof_case_[0] != 0xca) {
              clear_Type(this);
              this->_oneof_case_[0] = 0xca;
              this_09 = (Pipeline *)operator_new(0x48);
              Pipeline::Pipeline(this_09);
              (this->Type_).pipeline_ = this_09;
            }
            MergePartialFromCodedStream();
            uVar11 = extraout_RAX_08;
          }
        }
        goto LAB_001fe5b7;
      }
      if (9 < uVar7) {
        if (uVar7 == 200) {
          if (cVar9 == 'B') {
            if (this->_oneof_case_[0] != 200) {
              clear_Type(this);
              this->_oneof_case_[0] = 200;
              this_07 = (PipelineClassifier *)operator_new(0x20);
              PipelineClassifier::PipelineClassifier(this_07);
              (this->Type_).pipelineclassifier_ = this_07;
            }
            MergePartialFromCodedStream();
            uVar11 = extraout_RAX_06;
            goto LAB_001fe5b7;
          }
        }
        else if (uVar7 == 10) {
          MergePartialFromCodedStream();
          sVar5 = extraout_AX_00;
          goto LAB_001fe606;
        }
switchD_001fd7f3_caseD_25d:
        iVar6 = 7;
        if ((uVar10 & 7) == 4 || uVar10 == 0) goto LAB_001fd7b8;
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar10);
        if (!bVar4) {
          iVar6 = 6;
          goto LAB_001fd7b8;
        }
        goto LAB_001fd7b6;
      }
      if (uVar7 == 2) {
        if (cVar9 == '\x12') {
          if (this->description_ == (ModelDescription *)0x0) {
            this_04 = (ModelDescription *)operator_new(0x78);
            ModelDescription::ModelDescription(this_04);
            this->description_ = this_04;
          }
          MergePartialFromCodedStream();
          uVar11 = extraout_RAX_03;
          goto LAB_001fe5b7;
        }
        goto switchD_001fd7f3_caseD_25d;
      }
      if (uVar7 != 1) goto switchD_001fd7f3_caseD_25d;
      MergePartialFromCodedStream();
      sVar5 = extraout_AX;
LAB_001fe606:
      if (sVar5 == 0) goto switchD_001fd7f3_caseD_25d;
      iVar6 = 6;
      if (sVar5 != 1) goto LAB_001fd7b6;
    }
    else {
      if (uVar7 < 900) {
        switch(uVar7) {
        case 600:
          if (cVar9 == -0x3e) {
            if (this->_oneof_case_[0] != 600) {
              clear_Type(this);
              this->_oneof_case_[0] = 600;
              this_00 = (OneHotEncoder *)operator_new(0x28);
              OneHotEncoder::OneHotEncoder(this_00);
              (this->Type_).onehotencoder_ = this_00;
            }
            MergePartialFromCodedStream();
            uVar11 = extraout_RAX;
            goto LAB_001fe5b7;
          }
          break;
        case 0x259:
          if (cVar9 == -0x36) {
            if (this->_oneof_case_[0] != 0x259) {
              clear_Type(this);
              this->_oneof_case_[0] = 0x259;
              this_17 = (Imputer *)operator_new(0x30);
              Imputer::Imputer(this_17);
              (this->Type_).imputer_ = this_17;
            }
            MergePartialFromCodedStream();
            uVar11 = extraout_RAX_16;
            goto LAB_001fe5b7;
          }
          break;
        case 0x25a:
          if (cVar9 == -0x2e) {
            if (this->_oneof_case_[0] != 0x25a) {
              clear_Type(this);
              this->_oneof_case_[0] = 0x25a;
              this_15 = (FeatureVectorizer *)operator_new(0x30);
              FeatureVectorizer::FeatureVectorizer(this_15);
              (this->Type_).featurevectorizer_ = this_15;
            }
            MergePartialFromCodedStream();
            uVar11 = extraout_RAX_14;
            goto LAB_001fe5b7;
          }
          break;
        case 0x25b:
          if (cVar9 == -0x26) {
            if (this->_oneof_case_[0] != 0x25b) {
              clear_Type(this);
              this->_oneof_case_[0] = 0x25b;
              this_13 = (DictVectorizer *)operator_new(0x20);
              DictVectorizer::DictVectorizer(this_13);
              (this->Type_).dictvectorizer_ = this_13;
            }
            MergePartialFromCodedStream();
            uVar11 = extraout_RAX_12;
            goto LAB_001fe5b7;
          }
          break;
        case 0x25c:
          if (cVar9 == -0x1e) {
            if (this->_oneof_case_[0] != 0x25c) {
              clear_Type(this);
              this->_oneof_case_[0] = 0x25c;
              this_18 = (Scaler *)operator_new(0x40);
              Scaler::Scaler(this_18);
              (this->Type_).scaler_ = this_18;
            }
            MergePartialFromCodedStream();
            uVar11 = extraout_RAX_17;
            goto LAB_001fe5b7;
          }
          break;
        case 0x25d:
        case 0x260:
          break;
        case 0x25e:
          if (cVar9 == -0xe) {
            if (this->_oneof_case_[0] != 0x25e) {
              clear_Type(this);
              this->_oneof_case_[0] = 0x25e;
              this_14 = (CategoricalMapping *)operator_new(0x30);
              CategoricalMapping::CategoricalMapping(this_14);
              (this->Type_).categoricalmapping_ = this_14;
            }
            MergePartialFromCodedStream();
            uVar11 = extraout_RAX_13;
            goto LAB_001fe5b7;
          }
          break;
        case 0x25f:
          if (cVar9 == -6) {
            if (this->_oneof_case_[0] != 0x25f) {
              clear_Type(this);
              this->_oneof_case_[0] = 0x25f;
              this_12 = (Normalizer *)operator_new(0x18);
              Normalizer::Normalizer(this_12);
              (this->Type_).normalizer_ = this_12;
            }
            MergePartialFromCodedStream();
            uVar11 = extraout_RAX_11;
            goto LAB_001fe5b7;
          }
          break;
        case 0x261:
          if (cVar9 == '\n') {
            if (this->_oneof_case_[0] != 0x261) {
              clear_Type(this);
              this->_oneof_case_[0] = 0x261;
              this_16 = (ArrayFeatureExtractor *)operator_new(0x28);
              ArrayFeatureExtractor::ArrayFeatureExtractor(this_16);
              (this->Type_).arrayfeatureextractor_ = this_16;
            }
            MergePartialFromCodedStream();
            uVar11 = extraout_RAX_15;
            goto LAB_001fe5b7;
          }
          break;
        case 0x262:
          if (cVar9 == '\x12') {
            if (this->_oneof_case_[0] != 0x262) {
              clear_Type(this);
              this->_oneof_case_[0] = 0x262;
              this_11 = (NonMaximumSuppression *)operator_new(0x70);
              NonMaximumSuppression::NonMaximumSuppression(this_11);
              (this->Type_).nonmaximumsuppression_ = this_11;
            }
            MergePartialFromCodedStream();
            uVar11 = extraout_RAX_10;
            goto LAB_001fe5b7;
          }
          break;
        default:
          if ((uVar7 == 0x22c) && (cVar9 == 'b')) {
            if (this->_oneof_case_[0] != 0x22c) {
              clear_Type(this);
              this->_oneof_case_[0] = 0x22c;
              this_10 = (LinkedModel *)operator_new(0x20);
              LinkedModel::LinkedModel(this_10);
              (this->Type_).linkedmodel_ = this_10;
            }
            MergePartialFromCodedStream();
            uVar11 = extraout_RAX_09;
            goto LAB_001fe5b7;
          }
        }
        goto switchD_001fd7f3_caseD_25d;
      }
      switch(uVar7) {
      case 2000:
        if (cVar9 != -0x7e) goto switchD_001fd7f3_caseD_25d;
        if (this->_oneof_case_[0] != 2000) {
          clear_Type(this);
          this->_oneof_case_[0] = 2000;
          this_03 = (TextClassifier *)operator_new(0x38);
          CoreMLModels::TextClassifier::TextClassifier(this_03);
          (this->Type_).textclassifier_ = this_03;
        }
        MergePartialFromCodedStream();
        uVar11 = extraout_RAX_02;
        break;
      case 0x7d1:
        if (cVar9 != -0x76) goto switchD_001fd7f3_caseD_25d;
        if (this->_oneof_case_[0] != 0x7d1) {
          clear_Type(this);
          this->_oneof_case_[0] = 0x7d1;
          this_27 = (WordTagger *)operator_new(0x58);
          CoreMLModels::WordTagger::WordTagger(this_27);
          (this->Type_).wordtagger_ = this_27;
        }
        MergePartialFromCodedStream();
        uVar11 = extraout_RAX_26;
        break;
      case 0x7d2:
        if (cVar9 != -0x6e) goto switchD_001fd7f3_caseD_25d;
        if (this->_oneof_case_[0] != 0x7d2) {
          clear_Type(this);
          this->_oneof_case_[0] = 0x7d2;
          this_23 = (VisionFeaturePrint *)operator_new(0x20);
          CoreMLModels::VisionFeaturePrint::VisionFeaturePrint(this_23);
          (this->Type_).visionfeatureprint_ = this_23;
        }
        MergePartialFromCodedStream();
        uVar11 = extraout_RAX_22;
        break;
      case 0x7d3:
        if (cVar9 != -0x66) goto switchD_001fd7f3_caseD_25d;
        if (this->_oneof_case_[0] != 0x7d3) {
          clear_Type(this);
          this->_oneof_case_[0] = 0x7d3;
          this_26 = (SoundAnalysisPreprocessing *)operator_new(0x20);
          CoreMLModels::SoundAnalysisPreprocessing::SoundAnalysisPreprocessing(this_26);
          (this->Type_).soundanalysispreprocessing_ = this_26;
        }
        MergePartialFromCodedStream();
        uVar11 = extraout_RAX_25;
        break;
      case 0x7d4:
        if (cVar9 != -0x5e) goto switchD_001fd7f3_caseD_25d;
        if (this->_oneof_case_[0] != 0x7d4) {
          clear_Type(this);
          this->_oneof_case_[0] = 0x7d4;
          this_19 = (Gazetteer *)operator_new(0x38);
          CoreMLModels::Gazetteer::Gazetteer(this_19);
          (this->Type_).gazetteer_ = this_19;
        }
        MergePartialFromCodedStream();
        uVar11 = extraout_RAX_18;
        break;
      case 0x7d5:
        if (cVar9 != -0x56) goto switchD_001fd7f3_caseD_25d;
        if (this->_oneof_case_[0] != 0x7d5) {
          clear_Type(this);
          this->_oneof_case_[0] = 0x7d5;
          this_30 = (WordEmbedding *)operator_new(0x28);
          CoreMLModels::WordEmbedding::WordEmbedding(this_30);
          (this->Type_).wordembedding_ = this_30;
        }
        MergePartialFromCodedStream();
        uVar11 = extraout_RAX_29;
        break;
      case 0x7d6:
        if (cVar9 != -0x4e) goto switchD_001fd7f3_caseD_25d;
        if (this->_oneof_case_[0] != 0x7d6) {
          clear_Type(this);
          this->_oneof_case_[0] = 0x7d6;
          this_31 = (AudioFeaturePrint *)operator_new(0x20);
          CoreMLModels::AudioFeaturePrint::AudioFeaturePrint(this_31);
          (this->Type_).audiofeatureprint_ = this_31;
        }
        MergePartialFromCodedStream();
        uVar11 = extraout_RAX_30;
        break;
      default:
        if (uVar7 == 900) {
          if (cVar9 != '\"') goto switchD_001fd7f3_caseD_25d;
          if (this->_oneof_case_[0] != 900) {
            clear_Type(this);
            this->_oneof_case_[0] = 900;
            this_24 = (Identity *)operator_new(0x18);
            Identity::Identity(this_24);
            (this->Type_).identity_ = this_24;
          }
          MergePartialFromCodedStream();
          uVar11 = extraout_RAX_23;
        }
        else {
          if ((uVar7 != 3000) || (cVar9 != -0x3e)) goto switchD_001fd7f3_caseD_25d;
          if (this->_oneof_case_[0] != 3000) {
            clear_Type(this);
            this->_oneof_case_[0] = 3000;
            this_06 = (SerializedModel *)operator_new(0x28);
            SerializedModel::SerializedModel(this_06);
            (this->Type_).serializedmodel_ = this_06;
          }
          MergePartialFromCodedStream();
          uVar11 = extraout_RAX_05;
        }
      }
LAB_001fe5b7:
      iVar6 = local_5c;
      if ((uVar11 & 1) == 0) {
LAB_001fd7b6:
        iVar6 = 0;
      }
    }
LAB_001fd7b8:
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool Model::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Model)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(24002u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int32 specificationVersion = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &specificationversion_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ModelDescription description = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_description()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool isUpdatable = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &isupdatable_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.PipelineClassifier pipelineClassifier = 200;
      case 200: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1602u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_pipelineclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.PipelineRegressor pipelineRegressor = 201;
      case 201: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1610u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_pipelineregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Pipeline pipeline = 202;
      case 202: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1618u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_pipeline()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.GLMRegressor glmRegressor = 300;
      case 300: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(2402u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_glmregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SupportVectorRegressor supportVectorRegressor = 301;
      case 301: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(2410u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_supportvectorregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.TreeEnsembleRegressor treeEnsembleRegressor = 302;
      case 302: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(2418u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_treeensembleregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetworkRegressor neuralNetworkRegressor = 303;
      case 303: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(2426u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_neuralnetworkregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.BayesianProbitRegressor bayesianProbitRegressor = 304;
      case 304: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(2434u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bayesianprobitregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.GLMClassifier glmClassifier = 400;
      case 400: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(3202u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_glmclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SupportVectorClassifier supportVectorClassifier = 401;
      case 401: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(3210u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_supportvectorclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.TreeEnsembleClassifier treeEnsembleClassifier = 402;
      case 402: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(3218u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_treeensembleclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetworkClassifier neuralNetworkClassifier = 403;
      case 403: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(3226u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_neuralnetworkclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.KNearestNeighborsClassifier kNearestNeighborsClassifier = 404;
      case 404: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(3234u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_knearestneighborsclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetwork neuralNetwork = 500;
      case 500: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4002u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_neuralnetwork()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ItemSimilarityRecommender itemSimilarityRecommender = 501;
      case 501: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4010u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_itemsimilarityrecommender()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.MILSpec.Program mlProgram = 502;
      case 502: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4018u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_mlprogram()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CustomModel customModel = 555;
      case 555: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4442u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_custommodel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.LinkedModel linkedModel = 556;
      case 556: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4450u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_linkedmodel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.OneHotEncoder oneHotEncoder = 600;
      case 600: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_onehotencoder()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Imputer imputer = 601;
      case 601: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imputer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.FeatureVectorizer featureVectorizer = 602;
      case 602: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4818u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_featurevectorizer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DictVectorizer dictVectorizer = 603;
      case 603: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4826u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_dictvectorizer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Scaler scaler = 604;
      case 604: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4834u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_scaler()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CategoricalMapping categoricalMapping = 606;
      case 606: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4850u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_categoricalmapping()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Normalizer normalizer = 607;
      case 607: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4858u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_normalizer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ArrayFeatureExtractor arrayFeatureExtractor = 609;
      case 609: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4874u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_arrayfeatureextractor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NonMaximumSuppression nonMaximumSuppression = 610;
      case 610: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4882u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_nonmaximumsuppression()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Identity identity = 900;
      case 900: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(7202u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_identity()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.TextClassifier textClassifier = 2000;
      case 2000: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16002u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_textclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.WordTagger wordTagger = 2001;
      case 2001: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16010u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_wordtagger()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.VisionFeaturePrint visionFeaturePrint = 2002;
      case 2002: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16018u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_visionfeatureprint()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing soundAnalysisPreprocessing = 2003;
      case 2003: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16026u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_soundanalysispreprocessing()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.Gazetteer gazetteer = 2004;
      case 2004: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16034u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_gazetteer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.WordEmbedding wordEmbedding = 2005;
      case 2005: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16042u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_wordembedding()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.AudioFeaturePrint audioFeaturePrint = 2006;
      case 2006: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16050u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_audiofeatureprint()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SerializedModel serializedModel = 3000;
      case 3000: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24002u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_serializedmodel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Model)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Model)
  return false;
#undef DO_
}